

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O0

string * __thiscall
BindingEnv::LookupWithFallback
          (string *__return_storage_ptr__,BindingEnv *this,string *var,EvalString *eval,Env *env)

{
  bool bVar1;
  pointer ppVar2;
  allocator<char> local_41;
  _Self local_40;
  _Self local_38;
  iterator i;
  Env *env_local;
  EvalString *eval_local;
  string *var_local;
  BindingEnv *this_local;
  
  i._M_node = (_Base_ptr)env;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->bindings_,var);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->bindings_);
  bVar1 = std::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_38);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  else if (eval == (EvalString *)0x0) {
    if (this->parent_ == (BindingEnv *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_41);
      std::allocator<char>::~allocator(&local_41);
    }
    else {
      (*(this->parent_->super_Env)._vptr_Env[2])(__return_storage_ptr__,this->parent_,var);
    }
  }
  else {
    EvalString::Evaluate_abi_cxx11_(__return_storage_ptr__,eval,(Env *)i._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

string BindingEnv::LookupWithFallback(const string& var,
                                      const EvalString* eval,
                                      Env* env) {
  map<string, string>::iterator i = bindings_.find(var);
  if (i != bindings_.end())
    return i->second;

  if (eval)
    return eval->Evaluate(env);

  if (parent_)
    return parent_->LookupVariable(var);

  return "";
}